

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

PolymorphicInlineCacheInfo * __thiscall
Js::EntryPointPolymorphicInlineCacheInfo::EnsureInlineeInfo
          (EntryPointPolymorphicInlineCacheInfo *this,Recycler *recycler,
          FunctionBody *inlineeFunctionBody)

{
  Recycler *alloc;
  undefined8 *puVar1;
  undefined1 local_58 [8];
  TrackAllocData data;
  PolymorphicInlineCacheInfo *info;
  
  data._32_8_ = GetInlineeInfo(this,inlineeFunctionBody);
  if ((PolymorphicInlineCacheInfo *)data._32_8_ == (PolymorphicInlineCacheInfo *)0x0) {
    local_58 = (undefined1  [8])&PolymorphicInlineCacheInfo::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2ab601b;
    data.filename._0_4_ = 0x1fc4;
    alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_58);
    puVar1 = (undefined8 *)new<Memory::Recycler>(0x20,alloc,0x38bbb2);
    *puVar1 = 0;
    *(undefined4 *)(puVar1 + 1) = 0;
    puVar1[2] = 0;
    Memory::Recycler::WBSetBit((char *)(puVar1 + 3));
    puVar1[3] = inlineeFunctionBody;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(puVar1 + 3);
    data._32_8_ = puVar1;
    SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>::Prepend
              ((SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)
               &this->inlineeInfo,
               (this->inlineeInfo).
               super_SList<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.allocator,
               (PolymorphicInlineCacheInfo **)&data.line);
  }
  return (PolymorphicInlineCacheInfo *)data._32_8_;
}

Assistant:

PolymorphicInlineCacheInfo * EntryPointPolymorphicInlineCacheInfo::EnsureInlineeInfo(Recycler * recycler, FunctionBody * inlineeFunctionBody)
    {
        PolymorphicInlineCacheInfo * info = GetInlineeInfo(inlineeFunctionBody);
        if (!info)
        {
            info = RecyclerNew(recycler, PolymorphicInlineCacheInfo, inlineeFunctionBody);
            inlineeInfo.Prepend(info);
        }
        return info;
    }